

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_swift_generator.cc
# Opt level: O2

void __thiscall
t_swift_generator::generate_old_swift_struct
          (t_swift_generator *this,ostream *out,t_struct *tstruct,bool is_private)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  undefined4 extraout_var;
  undefined7 in_register_00000009;
  pointer pptVar4;
  char *pcVar5;
  string local_90;
  string visibility;
  string local_50;
  
  pcVar5 = "public";
  if ((int)CONCAT71(in_register_00000009,is_private) != 0) {
    pcVar5 = "private";
  }
  std::__cxx11::string::string((string *)&visibility,pcVar5,(allocator *)&local_90);
  t_generator::indent_abi_cxx11_(&local_90,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&local_90);
  poVar3 = std::operator<<(poVar3,(string *)&visibility);
  poVar3 = std::operator<<(poVar3," final class ");
  iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
  std::operator<<(poVar3,(string *)CONCAT44(extraout_var,iVar2));
  std::__cxx11::string::~string((string *)&local_90);
  iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[0xc])();
  if ((char)iVar2 != '\0') {
    std::operator<<(out," : ErrorType");
  }
  block_open(this,out);
  for (pptVar4 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      pptVar4 !=
      (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar4 = pptVar4 + 1) {
    std::operator<<(out,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_90,(t_generator *)this);
    poVar3 = std::operator<<(out,(string *)&local_90);
    declare_property_abi_cxx11_(&local_50,this,*pptVar4,is_private);
    poVar3 = std::operator<<(poVar3,(string *)&local_50);
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_90);
  }
  std::operator<<(out,(string *)&::endl_abi_cxx11_);
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,(string *)&visibility);
  std::operator<<(poVar3," init()");
  block_open(this,out);
  block_close(this,out,true);
  std::operator<<(out,(string *)&::endl_abi_cxx11_);
  bVar1 = struct_has_required_fields(this,tstruct);
  if (bVar1) {
    generate_swift_struct_init(this,out,tstruct,false,is_private);
  }
  bVar1 = struct_has_optional_fields(this,tstruct);
  if (bVar1) {
    generate_swift_struct_init(this,out,tstruct,true,is_private);
  }
  block_close(this,out,true);
  std::operator<<(out,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&visibility);
  return;
}

Assistant:

void t_swift_generator::generate_old_swift_struct(ostream& out,
                                                  t_struct* tstruct,
                                                  bool is_private) {
  string visibility = is_private ? "private" : "public";

  out << indent() << visibility << " final class " << tstruct->get_name();

  if (tstruct->is_xception()) {
    out << " : ErrorType";
  }

  block_open(out);

  // properties
  const vector<t_field*>& members = tstruct->get_members();
  vector<t_field*>::const_iterator m_iter;

  for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
    out << endl;
    out << indent() << declare_property(*m_iter, is_private) << endl;
  }

  out << endl;

  // init

  indent(out) << visibility << " init()";
  block_open(out);
  block_close(out);

  out << endl;

  if (struct_has_required_fields(tstruct)) {
    generate_swift_struct_init(out, tstruct, false, is_private);
  }
  if (struct_has_optional_fields(tstruct)) {
    generate_swift_struct_init(out, tstruct, true, is_private);
  }

  block_close(out);

  out << endl;
}